

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_core.c
# Opt level: O2

_Bool fiber_yield_time(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_fiber_t *fiber;
  gravity_fiber_t *pgVar1;
  nanotime_t nVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_value_t value;
  
  value.field_1.n = 0;
  value.isa = gravity_class_null;
  gravity_vm_setslot(vm,value,rindex);
  pgVar1 = gravity_vm_fiber(vm);
  if (args[1].isa == gravity_class_float) {
    aVar3 = args[1].field_1;
  }
  else {
    if (args[1].isa != gravity_class_int) goto LAB_0012928d;
    aVar3.f = (gravity_float_t)args[1].field_1.n;
  }
  pgVar1->timewait = (gravity_float_t)aVar3;
LAB_0012928d:
  nVar2 = nanotime();
  pgVar1->lasttime = nVar2;
  fiber = pgVar1->caller;
  if (fiber != (gravity_fiber_t *)0x0) {
    gravity_vm_setfiber(vm,fiber);
    pgVar1->caller = (fiber_s *)0x0;
    pgVar1->trying = false;
  }
  return fiber == (gravity_fiber_t *)0x0;
}

Assistant:

static bool fiber_yield_time (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(args, nargs, rindex)
    
    // set rindex slot to NULL in order to falsify the if closure check performed by the VM
    gravity_vm_setslot(vm, VALUE_FROM_NULL, rindex);
    
    // get currently executed fiber
    gravity_fiber_t *fiber = gravity_vm_fiber(vm);
    
    // if parameter is a float/int set its wait time (otherwise ignore it)
    if (VALUE_ISA_FLOAT(GET_VALUE(1))) {
        fiber->timewait = VALUE_AS_FLOAT(GET_VALUE(1));
    } else if (VALUE_ISA_INT(GET_VALUE(1))) {
        fiber->timewait = (gravity_float_t)GET_VALUE(1).n;
    }
    
    // update last time
    fiber->lasttime = nanotime();
    
    // in no caller then this is just a NOP
    if (fiber->caller) {
        gravity_vm_setfiber(vm, fiber->caller);

        // unhook this fiber from the one that called it
        fiber->caller = NULL;
        fiber->trying = false;

        RETURN_FIBER();
    } else {
        RETURN_NOVALUE();
    }
}